

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O1

string * __thiscall
flatbuffers::go::GoGenerator::GenTypeGet_abi_cxx11_
          (string *__return_storage_ptr__,GoGenerator *this,Type *type)

{
  allocator<char> local_9;
  
  if (type->enum_def == (EnumDef *)0x0) {
    if (type->base_type - BASE_TYPE_UTYPE < 0xc) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,
                 *(char **)(GenTypeBasic[abi:cxx11](flatbuffers::Type_const&)::ctypename +
                           (ulong)type->base_type * 8),&local_9);
    }
    else {
      GenTypePointer_abi_cxx11_(__return_storage_ptr__,this,type);
    }
  }
  else {
    GetEnumTypeName_abi_cxx11_(__return_storage_ptr__,this,type->enum_def);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenTypeGet(const Type &type) {
    if (type.enum_def != nullptr) { return GetEnumTypeName(*type.enum_def); }
    return IsScalar(type.base_type) ? GenTypeBasic(type) : GenTypePointer(type);
  }